

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynVariableDefinition * ParseVariableDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  Lexeme *end;
  SynBase *initializer;
  undefined4 extraout_var_00;
  SynVariableDefinition *this;
  InplaceStr name;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_string) {
    name = ParseContext::Consume(ctx);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pLVar3 = ParseContext::Previous(ctx);
    end = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar1),pLVar3,end,name);
    pLVar3 = ctx->currentLexeme;
    if (((int)name.end - (int)name.begin & 0xfffff800U) != 0) {
      anon_unknown.dwarf_153727::Stop
                (ctx,pLVar3,"ERROR: variable name length is limited to %d symbols",0x800);
    }
    if (pLVar3->type == lex_set) {
      ctx->currentLexeme = pLVar3 + 1;
      initializer = ParseAssignment(ctx);
      if (initializer == (SynBase *)0x0) {
        anon_unknown.dwarf_153727::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        initializer = (SynBase *)CONCAT44(extraout_var_00,iVar2);
        SynError::SynError((SynError *)initializer,ctx->currentLexeme,ctx->currentLexeme);
      }
    }
    else {
      initializer = (SynBase *)0x0;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynVariableDefinition *)CONCAT44(extraout_var_01,iVar2);
    pLVar3 = ParseContext::Previous(ctx);
    SynVariableDefinition::SynVariableDefinition
              (this,begin,pLVar3,(SynIdentifier *)CONCAT44(extraout_var,iVar1),initializer);
  }
  else {
    this = (SynVariableDefinition *)0x0;
  }
  return this;
}

Assistant:

SynVariableDefinition* ParseVariableDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(name.length() >= NULLC_MAX_VARIABLE_NAME_LENGTH)
			Stop(ctx, ctx.Current(), "ERROR: variable name length is limited to %d symbols", NULLC_MAX_VARIABLE_NAME_LENGTH);

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseAssignment(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynVariableDefinition>()) SynVariableDefinition(start, ctx.Previous(), nameIdentifier, initializer);
	}

	return NULL;
}